

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcList.c
# Opt level: O2

void Mvc_CoverDeleteCube_(Mvc_Cover_t *pCover,Mvc_Cube_t *pPrev,Mvc_Cube_t *pCube)

{
  int *piVar1;
  Mvc_Cube_t *pMVar2;
  Mvc_Cube_t *pMVar3;
  
  pMVar3 = (Mvc_Cube_t *)&pCover->lCubes;
  if (pPrev != (Mvc_Cube_t *)0x0) {
    pMVar3 = pPrev;
  }
  pMVar2 = pCube->pNext;
  pMVar3->pNext = pMVar2;
  if ((pCover->lCubes).pTail == pCube) {
    if (pMVar2 != (Mvc_Cube_t *)0x0) {
      __assert_fail("Mvc_CubeReadNext(pCube) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcList.c"
                    ,0xb7,"void Mvc_CoverDeleteCube_(Mvc_Cover_t *, Mvc_Cube_t *, Mvc_Cube_t *)");
    }
    (pCover->lCubes).pTail = pPrev;
  }
  piVar1 = &(pCover->lCubes).nItems;
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

void Mvc_CoverDeleteCube_( Mvc_Cover_t * pCover, Mvc_Cube_t * pPrev, Mvc_Cube_t * pCube )
{
    Mvc_List_t * pList = &pCover->lCubes;
 
    if ( pPrev == NULL ) // deleting the head cube
        pList->pHead = Mvc_CubeReadNext(pCube);
    else
        pPrev->pNext = pCube->pNext;
    if ( pList->pTail == pCube ) // deleting the tail cube
    {
        assert( Mvc_CubeReadNext(pCube) == NULL );
        pList->pTail = pPrev;
    }
    pList->nItems--;
}